

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-spell.c
# Opt level: O0

void unset_spells(bitflag *spells,bitflag *flags,bitflag *pflags,element_info *el,monster *mon)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  _Bool _Var4;
  _Bool _Var5;
  uint32_t uVar6;
  monster_spell *pmVar7;
  int iVar8;
  timed_failure *ptStack_60;
  _Bool resisted;
  timed_failure *f;
  wchar_t learn_chance;
  wchar_t element;
  effect *effect;
  monster_spell *spell;
  mon_spell_info *pmStack_38;
  _Bool smart;
  mon_spell_info *info;
  monster *mon_local;
  element_info *el_local;
  bitflag *pflags_local;
  bitflag *flags_local;
  bitflag *spells_local;
  
  _Var4 = monster_is_smart(mon);
  pmStack_38 = mon_spell_types;
  do {
    if (0x5b < pmStack_38->index) {
      return;
    }
    pmVar7 = monster_spell_by_index((uint)pmStack_38->index);
    if ((pmVar7 != (monster_spell *)0x0) &&
       (_Var5 = flag_has_dbg(spells,0xc,(uint)pmStack_38->index,"spells","info->index"), _Var5)) {
      _learn_chance = pmVar7->effect;
      if ((pmStack_38->type & 7U) == 0) {
        for (; _learn_chance != (effect *)0x0; _learn_chance = _learn_chance->next) {
          if (((_Var4) || (uVar6 = Rand_div(3), uVar6 != 0)) && (_learn_chance->index == 10)) {
            bVar3 = false;
            if ((_learn_chance->subtype < 0) || (0x34 < _learn_chance->subtype)) {
              __assert_fail("effect->subtype >= 0 && effect->subtype < TMD_MAX",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/mon-spell.c"
                            ,0x1f8,
                            "void unset_spells(bitflag *, bitflag *, bitflag *, struct element_info *, const struct monster *)"
                           );
            }
            ptStack_60 = timed_effects[_learn_chance->subtype].fail;
            while( true ) {
              bVar2 = false;
              if (ptStack_60 != (timed_failure *)0x0) {
                bVar2 = (bool)(bVar3 ^ 1);
              }
              if (!bVar2) break;
              switch(ptStack_60->code) {
              case 1:
                _Var5 = flag_has_dbg(flags,5,ptStack_60->idx,"flags","f->idx");
                if (_Var5) {
                  bVar3 = true;
                }
                break;
              case 2:
                if (0 < el[ptStack_60->idx].res_level) {
                  bVar3 = true;
                }
                break;
              case 3:
                if (el[ptStack_60->idx].res_level < 0) {
                  bVar3 = true;
                }
                break;
              case 4:
                _Var5 = flag_has_dbg(pflags,3,ptStack_60->idx,"pflags","f->idx");
                if (_Var5) {
                  bVar3 = true;
                }
                break;
              case 5:
              }
              ptStack_60 = ptStack_60->next;
            }
            if (bVar3) break;
          }
          if (((_Var4) || (uVar6 = Rand_div(2), uVar6 == 0)) &&
             ((_learn_chance->index == 0x17 &&
              (_Var5 = flag_has_dbg(pflags,3,10,"pflags","PF_NO_MANA"), _Var5)))) break;
        }
        if (_learn_chance != (effect *)0x0) {
          flag_off(spells,0xc,(uint)pmStack_38->index);
        }
      }
      else {
        sVar1 = el[_learn_chance->subtype].res_level;
        iVar8 = 0x19;
        if (_Var4) {
          iVar8 = 0x32;
        }
        uVar6 = Rand_div(100);
        if ((int)uVar6 < sVar1 * iVar8) {
          flag_off(spells,0xc,(uint)pmStack_38->index);
        }
      }
    }
    pmStack_38 = pmStack_38 + 1;
  } while( true );
}

Assistant:

void unset_spells(bitflag *spells, bitflag *flags, bitflag *pflags,
				  struct element_info *el, const struct monster *mon)
{
	const struct mon_spell_info *info;
	bool smart = monster_is_smart(mon);

	for (info = mon_spell_types; info->index < RSF_MAX; info++) {
		const struct monster_spell *spell = monster_spell_by_index(info->index);
		const struct effect *effect;

		/* Ignore missing spells */
		if (!spell) continue;
		if (!rsf_has(spells, info->index)) continue;

		/* Get the effect */
		effect = spell->effect;

		/* First we test the elemental spells */
		if (info->type & (RST_BOLT | RST_BALL | RST_BREATH)) {
			int element = effect->subtype;
			int learn_chance = el[element].res_level * (smart ? 50 : 25);
			if (randint0(100) < learn_chance) {
				rsf_off(spells, info->index);
			}
		} else {
			/* Now others with resisted effects */
			while (effect) {
				/* Timed effects */
				if ((smart || !one_in_(3))
						&& effect->index == EF_TIMED_INC) {
					const struct timed_failure *f;
					bool resisted = false;

					assert(effect->subtype >= 0
						&& effect->subtype < TMD_MAX);
					for (f = timed_effects[effect->subtype].fail;
							f && !resisted;
							f = f->next) {
						switch (f->code) {
						case TMD_FAIL_FLAG_OBJECT:
							if (of_has(flags, f->idx)) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_RESIST:
							if (el[f->idx].res_level > 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_VULN:
							if (el[f->idx].res_level < 0) {
								resisted = true;
							}
							break;

						case TMD_FAIL_FLAG_PLAYER:
							if (pf_has(pflags, f->idx)) {
								resisted = true;
							}
							break;

						/*
						 * The monster doesn't track
						 * the timed effects present
						 * on the player so do
						 * nothing with resistances
						 * due to those.
						 */
						case TMD_FAIL_FLAG_TIMED_EFFECT:
							break;
						}
					}
					if (resisted) {
						break;
					}
				}

				/* Mana drain */
				if ((smart || one_in_(2)) &&
						effect->index == EF_DRAIN_MANA &&
						pf_has(pflags, PF_NO_MANA))
					break;

				effect = effect->next;
			}
			if (effect)
				rsf_off(spells, info->index);
		}
	}
}